

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

counting_iterator
fmt::v10::detail::write_escaped_string<char,fmt::v10::detail::counting_iterator>
          (counting_iterator out,basic_string_view<char> str)

{
  char *pcVar1;
  char *in_RCX;
  counting_iterator local_98;
  value_type local_8a;
  char local_89;
  size_t local_88;
  size_t local_80;
  size_t local_78;
  size_t local_70;
  undefined1 local_68 [8];
  find_escape_result<char> escape;
  iterator end;
  iterator begin;
  counting_iterator local_38;
  value_type local_2a;
  char local_29;
  undefined1 local_28 [8];
  basic_string_view<char> str_local;
  counting_iterator out_local;
  
  str_local.data_ = (char *)str.size_;
  local_28 = (undefined1  [8])str.data_;
  local_29 = '\"';
  str_local.size_ = out.count_;
  local_38 = counting_iterator::operator++((counting_iterator *)&str_local.size_,0);
  counting_iterator::operator*(&local_38);
  counting_iterator::value_type::operator=(&local_2a,&local_29);
  end = basic_string_view<char>::begin((basic_string_view<char> *)local_28);
  escape._16_8_ = basic_string_view<char>::end((basic_string_view<char> *)local_28);
  do {
    find_escape((find_escape_result<char> *)local_68,(detail *)end,(char *)escape._16_8_,in_RCX);
    local_78 = str_local.size_;
    local_70 = (size_t)copy_str<char,char_const*,fmt::v10::detail::counting_iterator>
                                 (end,(char *)local_68,(counting_iterator)str_local.size_);
    pcVar1 = escape.begin;
    end = escape.begin;
    str_local.size_ = local_70;
    if (escape.begin == (char *)0x0) break;
    local_88 = local_70;
    local_80 = (size_t)write_escaped_cp<fmt::v10::detail::counting_iterator,char>
                                 ((counting_iterator)local_70,(find_escape_result<char> *)local_68);
    str_local.size_ = local_80;
  } while (pcVar1 != (char *)escape._16_8_);
  local_89 = '\"';
  local_98 = counting_iterator::operator++((counting_iterator *)&str_local.size_,0);
  counting_iterator::operator*(&local_98);
  counting_iterator::value_type::operator=(&local_8a,&local_89);
  return (counting_iterator)str_local.size_;
}

Assistant:

auto write_escaped_string(OutputIt out, basic_string_view<Char> str)
    -> OutputIt {
  *out++ = static_cast<Char>('"');
  auto begin = str.begin(), end = str.end();
  do {
    auto escape = find_escape(begin, end);
    out = copy_str<Char>(begin, escape.begin, out);
    begin = escape.end;
    if (!begin) break;
    out = write_escaped_cp<OutputIt, Char>(out, escape);
  } while (begin != end);
  *out++ = static_cast<Char>('"');
  return out;
}